

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TestCaseInfo::addFilenameTag(TestCaseInfo *this)

{
  size_type extraout_RDX;
  StringRef filename;
  StringRef rhs;
  StringRef local_78;
  StringRef local_68;
  StringRef local_58;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string combined;
  TestCaseInfo *this_local;
  
  combined.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"#",&local_31);
  std::allocator<char>::~allocator(&local_31);
  StringRef::StringRef(&local_68,(this->lineInfo).file);
  filename.m_size = extraout_RDX;
  filename.m_start = (char *)local_68.m_size;
  local_58 = anon_unknown_26::extractFilenamePart((anon_unknown_26 *)local_68.m_start,filename);
  rhs.m_start = (char *)local_58.m_size;
  rhs.m_size = (size_type)local_58.m_start;
  Catch::operator+=((Catch *)local_30,(string *)local_58.m_start,rhs);
  StringRef::StringRef(&local_78,(string *)local_30);
  internalAppendTag(this,local_78);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void TestCaseInfo::addFilenameTag() {
        std::string combined("#");
        combined += extractFilenamePart(lineInfo.file);
        internalAppendTag(combined);
    }